

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::dateTimeFormat(QLocale *this,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QVariant res;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_stack_fffffffffffffeb8;
  QVariant *in_stack_fffffffffffffec0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *this_00;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  FormatType in_stack_ffffffffffffff04;
  QLocale *in_stack_ffffffffffffff08;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_b8 [2];
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4ce896);
  if (pQVar2->m_data == &systemLocaleData) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4ce8f3);
    (*pQVar3->_vptr_QSystemLocale[2])(&local_28,pQVar3,(ulong)(0x16 - (in_EDX == 0)),local_48);
    ::QVariant::~QVariant(in_stack_fffffffffffffec0);
    bVar1 = ::QVariant::isNull((QVariant *)
                               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffecf = bVar1;
    if (!bVar1) {
      ::QVariant::toString((QVariant *)in_stack_fffffffffffffeb8);
    }
    ::QVariant::~QVariant(in_stack_fffffffffffffec0);
    if (!bVar1) goto LAB_004ceb07;
  }
  this_00 = local_b8;
  dateFormat(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  ::operator+((QString *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
              (char16_t *)this_00);
  timeFormat(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  ::operator+((QStringBuilder<QString,_char16_t> *)
              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),(QString *)this_00);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffeb8);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(this_00);
  QString::~QString((QString *)0x4cea67);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x4cea74);
  QString::~QString((QString *)0x4cea81);
LAB_004ceb07:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::dateTimeFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeFormatLong
                                             : QSystemLocale::DateTimeFormatShort,
                                             QVariant());
        if (!res.isNull()) {
            return res.toString();
        }
    }
#endif
    return dateFormat(format) + u' ' + timeFormat(format);
}